

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

int bmcg_sat_solver_minimize_assumptions(bmcg_sat_solver *s,int *plits,int nlits,int pivot)

{
  int iVar1;
  int iVar2;
  int iVar3;
  vec<int> *this;
  int *piVar4;
  int local_50;
  uint local_4c;
  int status;
  int nresR;
  int nresL;
  int nlitsR;
  int nlitsL;
  int i;
  vec<int> *array;
  int pivot_local;
  int nlits_local;
  int *plits_local;
  bmcg_sat_solver *s_local;
  
  this = (vec<int> *)((long)s + 0x38);
  if (pivot < 0) {
    __assert_fail("pivot >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                  ,0x101,
                  "int bmcg_sat_solver_minimize_assumptions(bmcg_sat_solver *, int *, int, int)");
  }
  if (nlits - pivot < 1) {
    __assert_fail("nlits - pivot >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                  ,0x103,
                  "int bmcg_sat_solver_minimize_assumptions(bmcg_sat_solver *, int *, int, int)");
  }
  if (nlits - pivot == 1) {
    iVar1 = bmcg_sat_solver_solve(s,plits,pivot);
    s_local._4_4_ = (uint)(iVar1 != -1);
  }
  else {
    if (nlits - pivot < 2) {
      __assert_fail("nlits - pivot >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                    ,0x10b,
                    "int bmcg_sat_solver_minimize_assumptions(bmcg_sat_solver *, int *, int, int)");
    }
    iVar1 = (nlits - pivot) / 2;
    iVar2 = (nlits - pivot) - iVar1;
    if (iVar1 + iVar2 != nlits - pivot) {
      __assert_fail("nlitsL + nlitsR == nlits - pivot",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                    ,0x10e,
                    "int bmcg_sat_solver_minimize_assumptions(bmcg_sat_solver *, int *, int, int)");
    }
    iVar3 = bmcg_sat_solver_solve(s,plits,pivot + iVar1);
    if (iVar3 == -1) {
      s_local._4_4_ = bmcg_sat_solver_minimize_assumptions(s,plits,pivot + iVar1,pivot);
    }
    else {
      if (iVar2 == 1) {
        local_4c = 1;
      }
      else {
        local_4c = bmcg_sat_solver_minimize_assumptions(s,plits,nlits,pivot + iVar1);
      }
      Gluco::vec<int>::clear(this,false);
      for (nlitsR = 0; nlitsR < iVar1; nlitsR = nlitsR + 1) {
        Gluco::vec<int>::push(this,plits + (pivot + nlitsR));
      }
      for (nlitsR = 0; nlitsR < (int)local_4c; nlitsR = nlitsR + 1) {
        plits[pivot + nlitsR] = plits[pivot + iVar1 + nlitsR];
      }
      for (nlitsR = 0; nlitsR < iVar1; nlitsR = nlitsR + 1) {
        piVar4 = Gluco::vec<int>::operator[](this,nlitsR);
        plits[(int)(pivot + local_4c + nlitsR)] = *piVar4;
      }
      iVar2 = bmcg_sat_solver_solve(s,plits,pivot + local_4c);
      if (iVar2 == -1) {
        s_local._4_4_ = local_4c;
      }
      else {
        if (iVar1 == 1) {
          local_50 = 1;
        }
        else {
          local_50 = bmcg_sat_solver_minimize_assumptions
                               (s,plits,pivot + local_4c + iVar1,pivot + local_4c);
        }
        s_local._4_4_ = local_4c + local_50;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

int bmcg_sat_solver_minimize_assumptions( bmcg_sat_solver * s, int * plits, int nlits, int pivot )
{
    vec<int>*array = &((Gluco::SimpSolver*)s)->user_vec;
    int i, nlitsL, nlitsR, nresL, nresR, status;
    assert( pivot >= 0 );
//    assert( nlits - pivot >= 2 );
    assert( nlits - pivot >= 1 );
    if ( nlits - pivot == 1 )
    {
        // since the problem is UNSAT, we try to solve it without assuming the last literal
        // if the result is UNSAT, the last literal can be dropped; otherwise, it is needed
        status = bmcg_sat_solver_solve( s, plits, pivot );
        return status != GLUCOSE_UNSAT; // return 1 if the problem is not UNSAT
    }
    assert( nlits - pivot >= 2 );
    nlitsL = (nlits - pivot) / 2;
    nlitsR = (nlits - pivot) - nlitsL;
    assert( nlitsL + nlitsR == nlits - pivot );
    // solve with these assumptions
    status = bmcg_sat_solver_solve( s, plits, pivot + nlitsL );
    if ( status == GLUCOSE_UNSAT ) // these are enough
        return bmcg_sat_solver_minimize_assumptions( s, plits, pivot + nlitsL, pivot );
    // these are not enough
    // solve for the right lits
//    nResL = nLitsR == 1 ? 1 : sat_solver_minimize_assumptions( s, pLits + nLitsL, nLitsR, nConfLimit );
    nresL = nlitsR == 1 ? 1 : bmcg_sat_solver_minimize_assumptions( s, plits, nlits, pivot + nlitsL );
    // swap literals
    array->clear();
    for ( i = 0; i < nlitsL; i++ )
        array->push(plits[pivot + i]);
    for ( i = 0; i < nresL; i++ )
        plits[pivot + i] = plits[pivot + nlitsL + i];
    for ( i = 0; i < nlitsL; i++ )
        plits[pivot + nresL + i] = (*array)[i];
    // solve with these assumptions
    status = bmcg_sat_solver_solve( s, plits, pivot + nresL );
    if ( status == GLUCOSE_UNSAT ) // these are enough
        return nresL;
    // solve for the left lits
//    nResR = nLitsL == 1 ? 1 : sat_solver_minimize_assumptions( s, pLits + nResL, nLitsL, nConfLimit );
    nresR = nlitsL == 1 ? 1 : bmcg_sat_solver_minimize_assumptions( s, plits, pivot + nresL + nlitsL, pivot + nresL );
    return nresL + nresR;
}